

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_build_canonical_arrays(uint64_t *cw_lens,uint64_t max_cw_length)

{
  uint64_t *puVar1;
  long lVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t uVar5;
  ulong *puVar6;
  uint64_t *puVar7;
  ulong uVar8;
  long lVar9;
  
  puVar4 = cw_lens + max_cw_length;
  puVar1 = cw_lens + 1;
  shuff_offset[0] = 0;
  if (1 < (long)max_cw_length) {
    puVar3 = shuff_offset;
    uVar5 = 0;
    puVar7 = puVar1;
    do {
      puVar3 = puVar3 + 1;
      uVar5 = uVar5 + *puVar7;
      puVar7 = puVar7 + 1;
      *puVar3 = uVar5;
    } while (puVar7 < puVar4);
  }
  puVar6 = (ulong *)(&std::__ioinit + max_cw_length * 8);
  *(undefined8 *)(&DAT_0014e4f8 + max_cw_length * 8) = 0;
  if ((ulong *)0x14e4ff < puVar6) {
    uVar8 = *(ulong *)(&DAT_0014e4f8 + max_cw_length * 8);
    do {
      uVar5 = *puVar4;
      puVar4 = puVar4 + -1;
      uVar8 = uVar8 + uVar5 >> 1;
      *puVar6 = uVar8;
      puVar6 = puVar6 + -1;
    } while ((ulong *)0x14e4ff < puVar6);
  }
  if (0 < (long)max_cw_length) {
    uVar8 = 0x3f;
    lVar2 = 0;
    do {
      if (*(long *)((long)puVar1 + lVar2) == 0) {
        lVar9 = *(long *)((long)&DAT_0014e6f8 + lVar2);
      }
      else {
        lVar9 = *(long *)((long)shuff_min_code + lVar2) << (uVar8 & 0x3f);
      }
      puVar4 = (uint64_t *)(lVar2 + 0x14e708);
      uVar8 = uVar8 - 1;
      *(long *)((long)shuff_lj_base + lVar2) = lVar9;
      lVar2 = lVar2 + 8;
    } while (puVar4 < shuff_lj_base + max_cw_length);
  }
  if (*puVar1 == 0) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)shuff_lj_base + lVar2) = 0xffffffffffffffff;
      lVar9 = lVar2 + 0x10;
      lVar2 = lVar2 + 8;
    } while (*(long *)((long)cw_lens + lVar9) == 0);
  }
  return;
}

Assistant:

void shuff_build_canonical_arrays(uint64_t* cw_lens, uint64_t max_cw_length)
{
    uint64_t* q;
    uint64_t* p;

    // build offset
    q = shuff_offset;
    *q = 0;
    for (p = cw_lens + 1; p < cw_lens + max_cw_length; p++, q++)
        *(q + 1) = *q + *p;

    // generate the min_code array
    // min_code[i] = (min_code[i+1] + cw_lens[i+2]) >>1
    q = shuff_min_code + max_cw_length - 1;
    *q = 0;
    for (q--, p = cw_lens + max_cw_length; q >= shuff_min_code; q--, p--)
        *q = (*(q + 1) + *p) >> 1;

    // generate the lj_base array
    q = shuff_lj_base;
    uint64_t* pp = shuff_min_code;
    int64_t left_shift = (sizeof(uint64_t) << 3) - 1;
    for (p = cw_lens + 1; q < shuff_lj_base + max_cw_length;
         p++, q++, pp++, left_shift--)
        if (*p == 0)
            *q = *(q - 1);
        else
            *q = (*pp) << left_shift;
    for (p = cw_lens + 1, q = shuff_lj_base; *p == 0; p++, q++)
        *q = SHUFF_MAX_ULONG;
}